

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_button_image(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_image img,
                      nk_button_behavior b,nk_style_button *style,nk_input *in)

{
  float fVar1;
  undefined1 local_5c [8];
  nk_rect content;
  int ret;
  nk_input *in_local;
  nk_style_button *style_local;
  nk_button_behavior b_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  nk_rect bounds_local;
  
  bounds_local._0_8_ = bounds._8_8_;
  register0x00001200 = bounds._0_8_;
  unique0x10000204 = in;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4dd6,
                  "int nk_do_button_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *)"
                 );
  }
  if (style != (nk_style_button *)0x0) {
    if (out != (nk_command_buffer *)0x0) {
      if (((out == (nk_command_buffer *)0x0) || (style == (nk_style_button *)0x0)) ||
         (state == (nk_flags *)0x0)) {
        bounds_local.w = 0.0;
      }
      else {
        content.w = (float)nk_do_button(state,out,bounds,style,in,b,(nk_rect *)local_5c);
        local_5c._0_4_ = (style->image_padding).x + (float)local_5c._0_4_;
        local_5c._4_4_ = (style->image_padding).y + (float)local_5c._4_4_;
        fVar1 = (style->image_padding).x;
        content.x = content.x - (fVar1 + fVar1);
        fVar1 = (style->image_padding).y;
        content.y = content.y - (fVar1 + fVar1);
        if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
        }
        nk_draw_button_image
                  (out,(nk_rect *)((long)&state_local + 4),(nk_rect *)local_5c,*state,style,&img);
        if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
        }
        bounds_local.w = content.w;
      }
      return (int)bounds_local.w;
    }
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4dd8,
                  "int nk_do_button_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *)"
                 );
  }
  __assert_fail("style",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x4dd7,
                "int nk_do_button_image(nk_flags *, struct nk_command_buffer *, struct nk_rect, struct nk_image, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *)"
               );
}

Assistant:

NK_LIB int
nk_do_button_image(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    struct nk_image img, enum nk_button_behavior b,
    const struct nk_style_button *style, const struct nk_input *in)
{
    int ret;
    struct nk_rect content;

    NK_ASSERT(state);
    NK_ASSERT(style);
    NK_ASSERT(out);
    if (!out || !style || !state)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, b, &content);
    content.x += style->image_padding.x;
    content.y += style->image_padding.y;
    content.w -= 2 * style->image_padding.x;
    content.h -= 2 * style->image_padding.y;

    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_image(out, &bounds, &content, *state, style, &img);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}